

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

FMStructDescList FMcopy_struct_list(FMStructDescList list)

{
  undefined8 *puVar1;
  ulong uVar2;
  FMStructDescList p_Var3;
  char *pcVar4;
  FMFieldList p_Var5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  lVar8 = -1;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    lVar8 = lVar8 + 1;
    uVar2 = uVar6 + 0x20;
  } while (*(long *)((long)&list->format_name + uVar6) != 0);
  p_Var3 = (FMStructDescList)ffs_malloc(uVar6 + 0x20 & 0x1fffffffe0);
  lVar7 = 0x18;
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    pcVar4 = strdup(*(char **)((long)list + lVar7 + -0x18));
    *(char **)((long)p_Var3 + lVar7 + -0x18) = pcVar4;
    p_Var5 = copy_field_list(*(FMFieldList *)((long)list + lVar7 + -0x10));
    *(FMFieldList *)((long)p_Var3 + lVar7 + -0x10) = p_Var5;
    *(undefined4 *)((long)p_Var3 + lVar7 + -8) = *(undefined4 *)((long)list + lVar7 + -8);
    *(undefined8 *)((long)&p_Var3->format_name + lVar7) =
         *(undefined8 *)((long)&list->format_name + lVar7);
    lVar7 = lVar7 + 0x20;
  }
  *(undefined8 *)((long)&p_Var3->opt_info + uVar6) = 0;
  puVar1 = (undefined8 *)((long)&p_Var3->format_name + uVar6);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)((long)&p_Var3->struct_size + uVar6) = 0;
  return p_Var3;
}

Assistant:

extern
FMStructDescList
FMcopy_struct_list(FMStructDescList list)
{
    int format_count = 0;
    FMStructDescList new_list;
    int format;

    while(list[format_count].format_name != NULL) format_count++;

    new_list = (FMStructDescList) malloc((size_t) sizeof(FMStructDescRec) *
					     (format_count + 1));
    for (format = 0; format < format_count; format++) {
	new_list[format].format_name = strdup(list[format].format_name);
	new_list[format].field_list = copy_field_list(list[format].field_list);
	new_list[format].struct_size = list[format].struct_size;
	new_list[format].opt_info = list[format].opt_info;
    }
    new_list[format_count].format_name = NULL;
    new_list[format_count].field_list = NULL;
    new_list[format_count].struct_size = 0;
    new_list[format_count].opt_info = NULL;
    return new_list;
}